

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O0

void __thiscall CompoundFile::Header::load(Header *this,istream *stream)

{
  int iVar1;
  undefined8 uVar2;
  char *in_RSI;
  Exception *in_RDI;
  int32_t sectorsInMSAT;
  int32_t msatFirstSecID;
  int32_t sectorsInSSAT;
  int32_t ssatFirstSecID;
  int32_t streamMinSize;
  int32_t dirStreamSecID;
  int32_t sectorsInSAT;
  int16_t shortSectorSizePower;
  int16_t sectorSizePower;
  char byteOrder [3];
  char fileID [9];
  size_t in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  wstring *what;
  SecID local_80;
  int32_t local_7c;
  undefined4 local_78;
  SecID local_74;
  int32_t local_70;
  undefined4 local_6c;
  SecID local_68;
  int32_t local_64;
  undefined4 local_60;
  undefined2 local_5c;
  undefined2 local_5a;
  char local_58 [3];
  undefined1 local_55;
  undefined1 local_41 [40];
  char local_19 [9];
  char *local_10;
  
  local_10 = in_RSI;
  memset(local_19,0,9);
  std::istream::read(local_10,(long)local_19);
  iVar1 = strcmp(cIdentifier,local_19);
  if (iVar1 != 0) {
    local_55 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    what = (wstring *)local_41;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring
              ((wstring *)(local_41 + 1),L"Wrong file identifier. It isn\'t a compound file.",
               (allocator *)what);
    Exception::Exception(in_RDI,what);
    local_55 = 0;
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  std::istream::seekg((long)local_10,0x14);
  memset(local_58,0,3);
  std::istream::read(local_10,(long)local_58);
  iVar1 = strcmp(local_58,(char *)&cLittleEndian);
  if (iVar1 == 0) {
    *(undefined4 *)in_RDI = 1;
  }
  else {
    *(undefined4 *)in_RDI = 0;
  }
  local_5a = 0;
  readData<short>((istream *)in_RDI,(short *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(int *)&in_RDI->field_0x4 = 1 << ((byte)local_5a & 0x1f);
  local_5c = 0;
  readData<short>((istream *)in_RDI,(short *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(int *)&in_RDI->field_0x8 = 1 << ((byte)local_5c & 0x1f);
  std::istream::seekg((long)local_10,10);
  local_60 = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(undefined4 *)&in_RDI->field_0xc = local_60;
  local_64 = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SecID::SecID(&local_68,local_64);
  *(int32_t *)&in_RDI->m_what = local_68.m_id;
  std::istream::seekg((long)local_10,4);
  local_6c = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(undefined4 *)&(in_RDI->m_what).field_0x4 = local_6c;
  local_70 = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SecID::SecID(&local_74,local_70);
  *(int32_t *)&(in_RDI->m_what)._M_string_length = local_74.m_id;
  local_78 = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(undefined4 *)((long)&(in_RDI->m_what)._M_string_length + 4) = local_78;
  local_7c = 0;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SecID::SecID(&local_80,local_7c);
  (in_RDI->m_what).field_2._M_local_buf[0] = local_80.m_id;
  readData<int>((istream *)in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  (in_RDI->m_what).field_2._M_local_buf[1] = L'\0';
  return;
}

Assistant:

inline void
Header::load( std::istream & stream )
{
	{
		char fileID[] =
			{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };

		stream.read( fileID, 8 );

		if( std::strcmp( cIdentifier, fileID ) != 0 )
			throw Exception( L"Wrong file identifier. "
				L"It isn't a compound file." );
	}

	stream.seekg( 20, std::ios::cur );

	{
		char byteOrder[] = { 0x00, 0x00, 0x00 };

		stream.read( byteOrder, 2 );

		if( std::strcmp( byteOrder, cLittleEndian ) == 0 )
			m_byteOrder = Excel::Stream::LittleEndian;
		else
			m_byteOrder = Excel::Stream::BigEndian;
	}

	{
		int16_t sectorSizePower = 0;

		readData( stream, sectorSizePower, 2 );

		m_sectorSize = 1 << sectorSizePower;
	}

	{
		int16_t shortSectorSizePower = 0;

		readData( stream, shortSectorSizePower, 2 );

		m_shortSectorSize = 1 << shortSectorSizePower;
	}

	stream.seekg( 10, std::ios::cur );

	{
		int32_t sectorsInSAT = 0;

		readData( stream, sectorsInSAT, 4 );

		m_sectorsInSAT = sectorsInSAT;
	}

	{
		int32_t dirStreamSecID = 0;

		readData( stream, dirStreamSecID, 4 );

		m_dirStreamSecID = dirStreamSecID;
	}

	stream.seekg( 4, std::ios::cur );

	{
		int32_t streamMinSize = 0;

		readData( stream, streamMinSize, 4 );

		m_streamMinSize = streamMinSize;
	}

	{
		int32_t ssatFirstSecID = 0;

		readData( stream, ssatFirstSecID, 4 );

		m_ssatFirstSecID = ssatFirstSecID;
	}

	{
		int32_t sectorsInSSAT = 0;

		readData( stream, sectorsInSSAT, 4 );

		m_sectorsInSSAT = sectorsInSSAT;
	}

	{
		int32_t msatFirstSecID = 0;

		readData( stream, msatFirstSecID, 4 );

		m_msatFirstSecID = msatFirstSecID;
	}

	{
		int32_t sectorsInMSAT = 0;

		readData( stream, sectorsInMSAT, 4 );

		m_sectorsInMSAT = sectorsInMSAT;
	}
}